

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HEkk::debugNonbasicFreeColumnSet(HEkk *this,HighsInt num_free_col,HSet *nonbasic_free_col_set)

{
  HighsLogOptions *log_options_;
  char cVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  uint *puVar7;
  const_reference pvVar8;
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar9;
  HSet *in_RDX;
  uint in_ESI;
  HSet *in_RDI;
  bool nonbasic_free_1;
  HighsInt iVar_2;
  HighsInt ix;
  vector<int,_std::allocator<int>_> *nonbasic_free_col_set_entry;
  bool nonbasic_free;
  HighsInt iVar_1;
  HighsInt check_num_nonbasic_free_col;
  HighsInt *num_nonbasic_free_col;
  bool nonbasic_free_col_ok;
  HighsInt iVar;
  HighsInt check_num_free_col;
  HighsInt num_tot;
  SimplexBasis *basis;
  HighsSimplexInfo *info;
  HighsLp *lp;
  HighsOptions *options;
  HSet *this_01;
  int local_74;
  int local_60;
  uint local_5c;
  int local_4c;
  uint local_48;
  HighsDebugStatus local_4;
  
  piVar3 = (in_RDI->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3[0x57] < 1) {
    local_4 = kNotChecked;
  }
  else {
    iVar5 = *(int *)&in_RDI[0x6b].log_file_ + *(int *)((long)&in_RDI[0x6b].log_file_ + 4);
    local_48 = 0;
    this_01 = in_RDI;
    for (local_4c = 0; local_4c < iVar5; local_4c = local_4c + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[0x78].log_file_,
                          (long)local_4c);
      if ((*pvVar6 <= -INFINITY) &&
         (pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &in_RDI[0x78].pointer_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(long)local_4c),
         INFINITY <= *pvVar6)) {
        local_48 = local_48 + 1;
      }
    }
    if (local_48 == in_ESI) {
      if (in_ESI == 0) {
        local_4 = kOk;
      }
      else {
        bVar4 = HSet::debug(this_01);
        if (bVar4) {
          puVar7 = (uint *)HSet::count(in_RDX);
          local_5c = 0;
          for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
            pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x85)
                                ,(long)local_60);
            bVar4 = false;
            if (*pvVar8 == '\x01') {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)&in_RDI[0x78].log_file_
                                  ,(long)local_60);
              bVar4 = false;
              if (*pvVar6 <= -INFINITY) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &in_RDI[0x78].pointer_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish,(long)local_60);
                bVar4 = INFINITY <= *pvVar6;
              }
            }
            if (bVar4) {
              local_5c = local_5c + 1;
            }
          }
          if (local_5c == *puVar7) {
            this_00 = HSet::entry(in_RDX);
            for (local_74 = 0; local_74 < (int)*puVar7; local_74 = local_74 + 1) {
              puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         (this_00,(long)local_74);
              uVar2 = *puVar9;
              pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (in_RDI + 0x85),(long)(int)uVar2);
              bVar4 = false;
              if (*pvVar8 == '\x01') {
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &in_RDI[0x78].log_file_,(long)(int)uVar2);
                bVar4 = false;
                if (*pvVar6 <= -INFINITY) {
                  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)
                                      &in_RDI[0x78].pointer_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish,(long)(int)uVar2);
                  bVar4 = INFINITY <= *pvVar6;
                }
              }
              if (!bVar4) {
                pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                   ((vector<signed_char,_std::allocator<signed_char>_> *)
                                    (in_RDI + 0x85),(long)(int)uVar2);
                cVar1 = *pvVar8;
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &in_RDI[0x78].log_file_,(long)(int)uVar2);
                log_options_ = (HighsLogOptions *)*pvVar6;
                pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &in_RDI[0x78].pointer_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish,(long)(int)uVar2);
                highsLogDev(log_options_,(HighsLogType)*pvVar6,(char *)(piVar3 + 0xe0),1,
                            "NonbasicFreeColumnData: Variable %d in nonbasic free set has nonbasicFlag = %d and bounds [%g, %g]\n"
                            ,(ulong)uVar2,(ulong)(uint)(int)cVar1);
                return kLogicalError;
              }
            }
            local_4 = kOk;
          }
          else {
            highsLogDev((HighsLogOptions *)(piVar3 + 0xe0),kInfo,
                        "NonbasicFreeColumnData: Set should have %d entries, not %d\n",
                        (ulong)local_5c,(ulong)*puVar7);
            local_4 = kLogicalError;
          }
        }
        else {
          highsLogDev((HighsLogOptions *)(piVar3 + 0xe0),kInfo,
                      "NonbasicFreeColumnData: HSet error\n");
          local_4 = kLogicalError;
        }
      }
    }
    else {
      highsLogDev((HighsLogOptions *)(piVar3 + 0xe0),kInfo,
                  "NonbasicFreeColumnData: Number of free columns should be %d, not %d\n",
                  (ulong)local_48,(ulong)in_ESI);
      local_4 = kLogicalError;
    }
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFreeColumnSet(
    const HighsInt num_free_col, const HSet nonbasic_free_col_set) const {
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;

  // Check the number of free columns
  HighsInt check_num_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (info.workLower_[iVar] <= -kHighsInf &&
        info.workUpper_[iVar] >= kHighsInf)
      check_num_free_col++;
  }
  if (check_num_free_col != num_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Number of free columns should be "
                "%" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT "\n",
                check_num_free_col, num_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  if (!num_free_col) return HighsDebugStatus::kOk;
  // Debug HSet nonbasic_free_col
  bool nonbasic_free_col_ok = nonbasic_free_col_set.debug();
  if (!nonbasic_free_col_ok) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: HSet error\n");
    return HighsDebugStatus::kLogicalError;
  }

  // Check that we have the right number of nonbasic free columns
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  HighsInt check_num_nonbasic_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (nonbasic_free) check_num_nonbasic_free_col++;
  }
  if (check_num_nonbasic_free_col != num_nonbasic_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Set should have %" HIGHSINT_FORMAT
                " entries, not %" HIGHSINT_FORMAT "\n",
                check_num_nonbasic_free_col, num_nonbasic_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  // Check that all in the set are nonbasic free columns
  const vector<HighsInt>& nonbasic_free_col_set_entry =
      nonbasic_free_col_set.entry();
  for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
    HighsInt iVar = nonbasic_free_col_set_entry[ix];
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (!nonbasic_free) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "NonbasicFreeColumnData: Variable %" HIGHSINT_FORMAT
                  " in nonbasic free "
                  "set has nonbasicFlag = %" HIGHSINT_FORMAT
                  " and bounds [%g, %g]\n",
                  iVar, basis.nonbasicFlag_[iVar], info.workLower_[iVar],
                  info.workUpper_[iVar]);
      return HighsDebugStatus::kLogicalError;
    }
  }
  return HighsDebugStatus::kOk;
}